

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O2

void __thiscall
dg::vr::StructureAnalyzer::setValidAreasByInstruction
          (StructureAnalyzer *this,VRLocation *location,
          vector<bool,_std::allocator<bool>_> *validAreas,VRInstruction *vrinst)

{
  Instruction *ptr;
  bool bVar1;
  ID IVar2;
  AllocationFunction AVar3;
  ret_type this_00;
  Function *pFVar4;
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> pVar5;
  reference rVar6;
  StringRef RHS;
  StringRef local_98;
  string local_88;
  AnalysisOptions options;
  
  ptr = vrinst->instruction;
  if (ptr[0x10] == (Instruction)0x3a) {
    pVar5 = getAllocatedAreaFor(this,(Value *)ptr);
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](validAreas,(ulong)pVar5.first);
    *rVar6._M_p = *rVar6._M_p | rVar6._M_mask;
  }
  this_00 = llvm::dyn_cast<llvm::IntrinsicInst,llvm::Instruction_const>(ptr);
  if (this_00 != (ret_type)0x0) {
    IVar2 = llvm::IntrinsicInst::getIntrinsicID(this_00);
    if (IVar2 == 0xa4) {
      pVar5 = getEqualArea(this,&location->relations,
                           *(Value **)
                            ((long)this_00 +
                            (0x20 - (ulong)(uint)(*(int *)&this_00->field_0x14 << 5))));
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](validAreas,(ulong)pVar5.first);
      *rVar6._M_p = *rVar6._M_p & ~rVar6._M_mask;
    }
  }
  if (ptr[0x10] == (Instruction)0x53) {
    pFVar4 = llvm::CallBase::getCalledFunction((CallBase *)ptr);
    if (pFVar4 != (Function *)0x0) {
      AnalysisOptions::AnalysisOptions(&options);
      local_98 = (StringRef)llvm::Value::getName();
      llvm::StringRef::str_abi_cxx11_(&local_88,&local_98);
      AVar3 = AnalysisOptions::getAllocationFunction(&options,&local_88);
      std::__cxx11::string::_M_dispose();
      if (AVar3 == REALLOC) {
        pVar5 = getEqualArea(this,&location->relations,
                             *(Value **)(ptr + -(ulong)(uint)(*(int *)(ptr + 0x14) << 5)));
        if (pVar5.second == (AllocatedArea *)0x0) {
          if (*(char *)(*(long *)(ptr + -(ulong)(uint)(*(int *)(ptr + 0x14) << 5)) + 0x10) != '\x12'
             ) {
            invalidateHeapAllocatedAreas(this,validAreas);
          }
        }
        else {
          rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (validAreas,(ulong)pVar5.first);
          *rVar6._M_p = *rVar6._M_p & ~rVar6._M_mask;
        }
      }
      local_88._0_16_ = llvm::Value::getName();
      RHS.Length = 4;
      RHS.Data = "free";
      bVar1 = llvm::StringRef::equals((StringRef *)&local_88,RHS);
      if (bVar1) {
        pVar5 = getEqualArea(this,&location->relations,
                             *(Value **)(ptr + -(ulong)(uint)(*(int *)(ptr + 0x14) << 5)));
        if (pVar5.second == (AllocatedArea *)0x0) {
          if (*(char *)(*(long *)(ptr + -(ulong)(uint)(*(int *)(ptr + 0x14) << 5)) + 0x10) != '\x12'
             ) {
            invalidateHeapAllocatedAreas(this,validAreas);
          }
        }
        else {
          rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (validAreas,(ulong)pVar5.first);
          *rVar6._M_p = *rVar6._M_p & ~rVar6._M_mask;
        }
      }
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
      ::~_Rb_tree(&options.allocationFunctions._M_t);
    }
  }
  return;
}

Assistant:

void StructureAnalyzer::setValidAreasByInstruction(
        VRLocation &location, std::vector<bool> &validAreas,
        VRInstruction *vrinst) const {
    const llvm::Instruction *inst = vrinst->getInstruction();
    unsigned index = 0;
    const AllocatedArea *area = nullptr;

    // every memory allocated on stack is considered allocated successfully
    if (llvm::isa<llvm::AllocaInst>(inst)) {
        std::tie(index, area) = getAllocatedAreaFor(inst);
        assert(area);
        validAreas[index] = true;
    }

    // if came across lifetime_end call, then mark memory whose scope ended
    // invalid
    if (const auto *intrinsic = llvm::dyn_cast<llvm::IntrinsicInst>(inst)) {
        if (intrinsic->getIntrinsicID() == llvm::Intrinsic::lifetime_end) {
            std::tie(index, area) =
                    getEqualArea(location.relations, intrinsic->getOperand(1));
            assert(area);
            validAreas[index] = false;
        }
    }

    if (const auto *call = llvm::dyn_cast<llvm::CallInst>(inst)) {
        auto *function = call->getCalledFunction();

        if (!function)
            return;

        AnalysisOptions options;
        if (options.getAllocationFunction(function->getName().str()) ==
            AllocationFunction::REALLOC) {
            // if realloc of memory occured, the reallocated memory cannot
            // be considered valid until the realloc is proven unsuccessful
            std::tie(index, area) =
                    getEqualArea(location.relations, call->getOperand(0));
            if (area)
                validAreas[index] = false;
            else if (!llvm::isa<llvm::ConstantPointerNull>(
                             call->getOperand(0))) {
                // else we do not know which area has been reallocated and
                // thus possibly invalidated, so it may have been any of
                // them
                invalidateHeapAllocatedAreas(validAreas);
            }
        }

        if (function->getName().equals("free")) {
            // if free occures, the freed memory cannot be considered valid
            // anymore
            std::tie(index, area) =
                    getEqualArea(location.relations, call->getOperand(0));

            if (area)
                validAreas[index] = false;
            else if (!llvm::isa<llvm::ConstantPointerNull>(
                             call->getOperand(0))) {
                // else we do not know which area has been freed, so it may
                // have been any of them
                invalidateHeapAllocatedAreas(validAreas);
            }
        }
    }
}